

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::write_number<long>(t_json_generator *this,long n)

{
  string local_38;
  long local_18;
  long n_local;
  t_json_generator *this_local;
  
  local_18 = n;
  n_local = (long)this;
  number_to_string<long>(&local_38,this,n);
  std::operator<<((ostream *)&this->f_json_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void write_number(T n) {
    f_json_ << number_to_string(n);
  }